

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

bool __thiscall LockedPool::new_arena(LockedPool *this,size_t size,size_t align)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long *puVar3;
  pointer pLVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *this_00;
  unsigned_long in_RSI;
  void **in_RDI;
  long in_FS_OFFSET;
  void *addr;
  size_t limit;
  bool locked;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  void **__args_3;
  void **__args_1;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte local_19 [9];
  unsigned_long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __args_1 = in_RDI;
  local_10 = in_RSI;
  bVar1 = std::__cxx11::
          list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::empty
                    (in_stack_ffffffffffffff98);
  if (bVar1) {
    pLVar4 = std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::
             operator->((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>
                         *)in_stack_ffffffffffffff98);
    iVar2 = (*pLVar4->_vptr_LockedPageAllocator[4])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      puVar3 = std::min<unsigned_long>
                         ((unsigned_long *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                          (unsigned_long *)in_stack_ffffffffffffff98);
      local_10 = *puVar3;
    }
  }
  pLVar4 = std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::
           operator->((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)
                      in_stack_ffffffffffffff98);
  iVar2 = (*pLVar4->_vptr_LockedPageAllocator[2])(pLVar4,local_10,local_19);
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    bVar1 = false;
  }
  else {
    if ((local_19[0] & 1) == 0) {
      if ((in_RDI[4] != (void *)0x0) && (uVar5 = (*(code *)in_RDI[4])(), (uVar5 & 1) == 0)) {
        pLVar4 = std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::
                 operator->((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>
                             *)in_stack_ffffffffffffff98);
        (*pLVar4->_vptr_LockedPageAllocator[3])(pLVar4,CONCAT44(extraout_var_00,iVar2),local_10);
        bVar1 = false;
        goto LAB_003c55d4;
      }
    }
    else {
      in_RDI[5] = (void *)(local_10 + (long)in_RDI[5]);
    }
    __args_3 = in_RDI + 1;
    this_00 = (list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *)
              std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::get
                        ((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>
                          *)in_stack_ffffffffffffff98);
    std::__cxx11::list<LockedPool::LockedPageArena,std::allocator<LockedPool::LockedPageArena>>::
    emplace_back<LockedPageAllocator*,void*&,unsigned_long&,unsigned_long&>
              (this_00,(LockedPageAllocator **)
                       CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),__args_1,
               (unsigned_long *)in_RDI,(unsigned_long *)__args_3);
    bVar1 = true;
  }
LAB_003c55d4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool LockedPool::new_arena(size_t size, size_t align)
{
    bool locked;
    // If this is the first arena, handle this specially: Cap the upper size
    // by the process limit. This makes sure that the first arena will at least
    // be locked. An exception to this is if the process limit is 0:
    // in this case no memory can be locked at all so we'll skip past this logic.
    if (arenas.empty()) {
        size_t limit = allocator->GetLimit();
        if (limit > 0) {
            size = std::min(size, limit);
        }
    }
    void *addr = allocator->AllocateLocked(size, &locked);
    if (!addr) {
        return false;
    }
    if (locked) {
        cumulative_bytes_locked += size;
    } else if (lf_cb) { // Call the locking-failed callback if locking failed
        if (!lf_cb()) { // If the callback returns false, free the memory and fail, otherwise consider the user warned and proceed.
            allocator->FreeLocked(addr, size);
            return false;
        }
    }
    arenas.emplace_back(allocator.get(), addr, size, align);
    return true;
}